

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsteeppr.hpp
# Opt level: O3

void __thiscall
soplex::
SPxSteepPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::removedCoVecs(SPxSteepPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *this,int *perm)

{
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_00;
  undefined8 *puVar1;
  uint *puVar2;
  pointer pnVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  uint uVar7;
  long lVar8;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar9;
  ulong uVar10;
  long lVar11;
  
  pSVar9 = (this->
           super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thesolver;
  this_00 = &pSVar9->coWeights;
  uVar7 = (int)((long)(pSVar9->coWeights).val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(pSVar9->coWeights).val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x49249249;
  if (0 < (int)uVar7) {
    lVar8 = 0xc;
    uVar10 = 0;
    do {
      lVar11 = (long)perm[uVar10];
      if (-1 < lVar11) {
        pnVar3 = (this_00->val).
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        *(undefined8 *)((long)&pnVar3[lVar11].m_backend.data + 0x20) =
             *(undefined8 *)((long)&(pnVar3->m_backend).data + lVar8 * 4 + -0x10);
        puVar1 = (undefined8 *)((long)&(pnVar3->m_backend).data + lVar8 * 4 + -0x30);
        uVar4 = *puVar1;
        uVar5 = puVar1[1];
        puVar1 = (undefined8 *)((long)&(pnVar3->m_backend).data + lVar8 * 4 + -0x20);
        uVar6 = puVar1[1];
        puVar2 = (uint *)((long)&pnVar3[lVar11].m_backend.data + 0x10);
        *(undefined8 *)puVar2 = *puVar1;
        *(undefined8 *)(puVar2 + 2) = uVar6;
        *(undefined8 *)&pnVar3[lVar11].m_backend.data = uVar4;
        *(undefined8 *)((long)&pnVar3[lVar11].m_backend.data + 8) = uVar5;
        pnVar3[lVar11].m_backend.exp = *(int *)((long)&(pnVar3->m_backend).data + lVar8 * 4 + -8);
        pnVar3[lVar11].m_backend.neg = *(bool *)((long)&(pnVar3->m_backend).data + lVar8 * 4 + -4);
        uVar4 = *(undefined8 *)((long)&(pnVar3->m_backend).data + lVar8 * 4);
        pnVar3[lVar11].m_backend.fpclass = (int)uVar4;
        pnVar3[lVar11].m_backend.prec_elem = (int)((ulong)uVar4 >> 0x20);
      }
      uVar10 = uVar10 + 1;
      lVar8 = lVar8 + 0xe;
    } while ((uVar7 & 0x7fffffff) != uVar10);
    pSVar9 = (this->
             super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).thesolver;
  }
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::reDim(this_00,(pSVar9->thecovectors->set).thenum,true);
  return;
}

Assistant:

void SPxSteepPR<R>::removedCoVecs(const int perm[])
{
   assert(this->thesolver != nullptr);
   VectorBase<R>& coWeights = this->thesolver->coWeights;
   int i;
   int j = coWeights.dim();

   for(i = 0; i < j; ++i)
   {
      if(perm[i] >= 0)
         coWeights[perm[i]] = coWeights[i];
   }

   coWeights.reDim(this->thesolver->dim());
}